

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation.cc
# Opt level: O1

int webrtc::WebRtcAec_GetMetrics(void *handle,AecMetrics *metrics)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aec *self;
  Stats a_nlp;
  Stats erle;
  Stats erl;
  Stats local_a8;
  Stats local_78;
  Stats local_48;
  
  if (handle != (void *)0x0) {
    if (metrics == (AecMetrics *)0x0) {
      iVar2 = 0x2ee3;
    }
    else {
      iVar2 = 0x2ee2;
      if (*(short *)((long)handle + 0x24) == 0x2a) {
        WebRtcAec_GetEchoStats
                  (*(AecCore **)((long)handle + 0x70),&local_48,&local_78,&local_a8,
                   &metrics->divergent_filter_fraction);
        (metrics->erl).instant = (int)local_48.instant;
        iVar2 = (int)(local_48.himean * 0.7 + local_48.average * 0.3);
        if (local_48.average <= -100.0 || local_48.himean <= -100.0) {
          iVar2 = -100;
        }
        (metrics->erl).average = iVar2;
        (metrics->erl).max = (int)local_48.max;
        iVar3 = (int)local_48.min;
        if (100.0 <= local_48.min) {
          iVar3 = -100;
        }
        (metrics->erl).min = iVar3;
        (metrics->erle).instant = (int)local_78.instant;
        iVar3 = (int)(local_78.himean * 0.7 + local_78.average * 0.3);
        if (local_78.average <= -100.0 || local_78.himean <= -100.0) {
          iVar3 = -100;
        }
        (metrics->erle).average = iVar3;
        (metrics->erle).max = (int)local_78.max;
        iVar3 = (int)local_78.min;
        if (100.0 <= local_78.min) {
          iVar3 = -100;
        }
        (metrics->erle).min = iVar3;
        iVar3 = -100;
        if (-100 < iVar2) {
          iVar1 = (metrics->erle).average;
          iVar3 = -100;
          if (-100 < iVar1) {
            iVar3 = iVar2 + iVar1;
          }
        }
        (metrics->rerl).average = iVar3;
        (metrics->rerl).instant = iVar3;
        (metrics->rerl).max = iVar3;
        (metrics->rerl).min = iVar3;
        (metrics->aNlp).instant = (int)local_a8.instant;
        iVar2 = (int)(local_a8.himean * 0.7 + local_a8.average * 0.3);
        if (local_a8.average <= -100.0 || local_a8.himean <= -100.0) {
          iVar2 = -100;
        }
        (metrics->aNlp).average = iVar2;
        (metrics->aNlp).max = (int)local_a8.max;
        iVar2 = (int)local_a8.min;
        if (100.0 <= local_a8.min) {
          iVar2 = -100;
        }
        (metrics->aNlp).min = iVar2;
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  return -1;
}

Assistant:

int WebRtcAec_GetMetrics(void* handle, AecMetrics* metrics) {
  const float kUpWeight = 0.7f;
  float dtmp;
  int stmp;
  Aec* self = reinterpret_cast<Aec*>(handle);
  Stats erl;
  Stats erle;
  Stats a_nlp;

  if (handle == NULL) {
    return -1;
  }
  if (metrics == NULL) {
    return AEC_NULL_POINTER_ERROR;
  }
  if (self->initFlag != initCheck) {
    return AEC_UNINITIALIZED_ERROR;
  }

  WebRtcAec_GetEchoStats(self->aec, &erl, &erle, &a_nlp,
                         &metrics->divergent_filter_fraction);

  // ERL
  metrics->erl.instant = static_cast<int>(erl.instant);

  if ((erl.himean > kOffsetLevel) && (erl.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * erl.himean + (1 - kUpWeight) * erl.average;
    metrics->erl.average = static_cast<int>(dtmp);
  } else {
    metrics->erl.average = kOffsetLevel;
  }

  metrics->erl.max = static_cast<int>(erl.max);

  if (erl.min < (kOffsetLevel * (-1))) {
    metrics->erl.min = static_cast<int>(erl.min);
  } else {
    metrics->erl.min = kOffsetLevel;
  }

  // ERLE
  metrics->erle.instant = static_cast<int>(erle.instant);

  if ((erle.himean > kOffsetLevel) && (erle.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * erle.himean + (1 - kUpWeight) * erle.average;
    metrics->erle.average = static_cast<int>(dtmp);
  } else {
    metrics->erle.average = kOffsetLevel;
  }

  metrics->erle.max = static_cast<int>(erle.max);

  if (erle.min < (kOffsetLevel * (-1))) {
    metrics->erle.min = static_cast<int>(erle.min);
  } else {
    metrics->erle.min = kOffsetLevel;
  }

  // RERL
  if ((metrics->erl.average > kOffsetLevel) &&
      (metrics->erle.average > kOffsetLevel)) {
    stmp = metrics->erl.average + metrics->erle.average;
  } else {
    stmp = kOffsetLevel;
  }
  metrics->rerl.average = stmp;

  // No other statistics needed, but returned for completeness.
  metrics->rerl.instant = stmp;
  metrics->rerl.max = stmp;
  metrics->rerl.min = stmp;

  // A_NLP
  metrics->aNlp.instant = static_cast<int>(a_nlp.instant);

  if ((a_nlp.himean > kOffsetLevel) && (a_nlp.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * a_nlp.himean + (1 - kUpWeight) * a_nlp.average;
    metrics->aNlp.average = static_cast<int>(dtmp);
  } else {
    metrics->aNlp.average = kOffsetLevel;
  }

  metrics->aNlp.max = static_cast<int>(a_nlp.max);

  if (a_nlp.min < (kOffsetLevel * (-1))) {
    metrics->aNlp.min = static_cast<int>(a_nlp.min);
  } else {
    metrics->aNlp.min = kOffsetLevel;
  }

  return 0;
}